

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

termchar * term_bidi_line(Terminal *term,termline *ldata,wchar_t scr_y)

{
  short *psVar1;
  truecolour *ptVar2;
  ushort uVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  wchar_t *pwVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  _Bool _Var11;
  wchar_t wVar12;
  bidi_char *pbVar13;
  termchar *ptVar14;
  bidi_cache_entry *pbVar15;
  bidi_cache_entry *pbVar16;
  termchar *ptVar17;
  wchar_t *pwVar18;
  ulong oldlen;
  wchar_t wVar19;
  unsigned_short *puVar20;
  termchar **pptVar21;
  undefined4 uVar22;
  uint uVar23;
  unicode_data *puVar24;
  long lVar25;
  ulong uVar26;
  unsigned_long *puVar27;
  ulong uVar28;
  size_t factor1;
  wchar_t wVar29;
  int iVar30;
  termchar *ptVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  
  if (((term->no_bidi == true) && (term->no_arabicshaping == true)) &&
     ((ldata->trusted != true || (term->cols < L'\x04')))) {
    return (termchar *)0x0;
  }
  wVar29 = term->cols;
  uVar34 = (ulong)(uint)wVar29;
  pbVar15 = term->pre_bidi_cache;
  oldlen = (ulong)scr_y;
  if ((((pbVar15 != (bidi_cache_entry *)0x0) && (oldlen < term->bidi_cache_size)) &&
      (ptVar14 = pbVar15[oldlen].chars, ptVar14 != (termchar *)0x0)) &&
     ((pbVar15[oldlen].width == wVar29 && (pbVar15[oldlen].trusted == ldata->trusted)))) {
    if (L'\0' < wVar29) {
      ptVar31 = ldata->chars;
      uVar32 = uVar34;
      do {
        _Var11 = termchars_equal_override(ptVar14,ptVar31,ptVar31->chr,ptVar31->attr);
        if (!_Var11) goto LAB_0010bcff;
        ptVar31 = ptVar31 + 1;
        ptVar14 = ptVar14 + 1;
        uVar32 = uVar32 - 1;
      } while (uVar32 != 0);
    }
    pptVar21 = &term->post_bidi_cache[oldlen].chars;
    goto LAB_0010c38a;
  }
LAB_0010bcff:
  if (term->wcFromTo_size < wVar29) {
    term->wcFromTo_size = wVar29;
    pbVar13 = (bidi_char *)saferealloc(term->wcFrom,(long)wVar29,0xc);
    term->wcFrom = pbVar13;
    pbVar13 = (bidi_char *)saferealloc(term->wcTo,(long)term->wcFromTo_size,0xc);
    term->wcTo = pbVar13;
    uVar34 = (ulong)(uint)term->cols;
  }
  iVar30 = (int)uVar34;
  if (iVar30 < 1) {
LAB_0010befd:
    wVar29 = L'\0';
  }
  else {
    ptVar14 = ldata->chars;
    puVar20 = &term->wcFrom->nchars;
    uVar32 = 0;
    do {
      uVar28 = ptVar14->chr;
      uVar23 = (uint)uVar28 & 0xffffff00;
      if (uVar23 == 0xda00) {
        pwVar18 = term->ucsdata->unitab_scoacs;
LAB_0010bdc6:
        uVar28 = (ulong)(uint)pwVar18[uVar28 & 0xff];
      }
      else {
        if (uVar23 == 0xd900) {
          puVar24 = term->ucsdata;
          if (term->rawcnp != false) goto LAB_0010bda9;
          pwVar18 = puVar24->unitab_xterm;
          goto LAB_0010bdc6;
        }
        if (uVar23 == 0xd800) {
          puVar24 = term->ucsdata;
LAB_0010bda9:
          pwVar18 = puVar24->unitab_line;
          goto LAB_0010bdc6;
        }
      }
      uVar23 = (uint)uVar28;
      if ((uVar23 & 0xffffff00) == 0xdd00) {
        lVar25 = 0x80c;
LAB_0010bdf8:
        uVar23 = *(uint *)((long)term->ucsdata->unitab_scoacs + (uVar28 & 0xff) * 4 + lVar25 + -0xc)
        ;
      }
      else if ((uVar23 & 0xffffff00) == 0xdc00) {
        lVar25 = 0x100c;
        goto LAB_0010bdf8;
      }
      *(uint *)(puVar20 + -3) = uVar23;
      ((bidi_char *)(puVar20 + -5))->origwc = uVar23;
      puVar20[-1] = (unsigned_short)uVar32;
      *puVar20 = 1;
      uVar32 = uVar32 + 1;
      puVar20 = puVar20 + 6;
      ptVar14 = ptVar14 + 1;
    } while (uVar34 != uVar32);
    if ((3 < iVar30) && (ldata->trusted != false)) {
      memmove(term->wcFrom + 3,term->wcFrom,(ulong)(iVar30 - 3) * 0xc);
      pbVar13 = term->wcFrom;
      lVar25 = 0;
      do {
        uVar22 = 0x20;
        if (lVar25 == 0xc) {
          uVar22 = 0xdfff;
        }
        if (lVar25 == 0) {
          uVar22 = 0xdffe;
        }
        *(undefined4 *)((long)&pbVar13->wc + lVar25) = uVar22;
        *(undefined4 *)((long)&pbVar13->origwc + lVar25) = uVar22;
        *(undefined4 *)((long)&pbVar13->index + lVar25) = 0x1ffff;
        lVar25 = lVar25 + 0xc;
      } while (lVar25 != 0x24);
      if (term->cols < L'\x01') goto LAB_0010befd;
    }
    wVar29 = L'\0';
    lVar25 = 0;
    wVar12 = L'\0';
    do {
      pbVar13 = term->wcFrom;
      *(undefined4 *)((long)&pbVar13->index + lVar25) = *(undefined4 *)&pbVar13[wVar12].index;
      *(undefined8 *)((long)&pbVar13->origwc + lVar25) = *(undefined8 *)(pbVar13 + wVar12);
      wVar19 = wVar12 + L'\x01';
      wVar4 = term->cols;
      if ((wVar19 < wVar4) && (term->wcFrom[wVar19].wc == 0xdfff)) {
        psVar1 = (short *)((long)&term->wcFrom->nchars + lVar25);
        *psVar1 = *psVar1 + 1;
        wVar19 = wVar12 + L'\x02';
      }
      lVar25 = lVar25 + 0xc;
      wVar29 = wVar29 + L'\x01';
      wVar12 = wVar19;
    } while (wVar19 < wVar4);
  }
  uVar34 = (ulong)(uint)wVar29;
  if (term->no_bidi == false) {
    do_bidi(term->bidi_ctx,term->wcFrom,uVar34);
  }
  if (term->no_arabicshaping == false) {
    do_shape(term->wcFrom,term->wcTo,wVar29);
  }
  else {
    memcpy(term->wcTo,term->wcFrom,uVar34 * 0xc);
  }
  wVar12 = ldata->size;
  if (term->ltemp_size < wVar12) {
    term->ltemp_size = wVar12;
    ptVar14 = (termchar *)saferealloc(term->ltemp,(long)wVar12,0x20);
    term->ltemp = ptVar14;
    wVar12 = ldata->size;
  }
  else {
    ptVar14 = term->ltemp;
  }
  pptVar21 = &term->ltemp;
  memcpy(ptVar14,ldata->chars,(long)wVar12 << 5);
  if (wVar29 == L'\0') {
    wVar29 = L'\0';
  }
  else {
    pbVar13 = term->wcTo;
    uVar32 = 0;
    wVar29 = L'\0';
    do {
      if (pbVar13[uVar32].nchars != 0) {
        uVar3 = pbVar13[uVar32].index;
        lVar25 = (long)wVar29 << 5;
        iVar30 = -wVar29;
        uVar23 = 0;
        do {
          puVar27 = (unsigned_long *)((long)&(*pptVar21)->chr + lVar25);
          if (uVar3 == 0xffff) {
            uVar8 = (term->basic_erase_char).chr;
            uVar9 = (term->basic_erase_char).attr;
            uVar10 = *(unsigned_long *)&(term->basic_erase_char).cc_next;
            *(truecolour *)(puVar27 + 2) = (term->basic_erase_char).truecolour;
            puVar27[3] = uVar10;
            *puVar27 = uVar8;
            puVar27[1] = uVar9;
            uVar28 = 0xdfff;
            if (uVar23 == 0) {
              uVar28 = (ulong)term->wcTo[uVar32].origwc;
            }
            ptVar14 = *pptVar21;
LAB_0010c087:
            *(ulong *)((long)&ptVar14->chr + lVar25) = uVar28;
          }
          else {
            ptVar14 = ldata->chars + uVar3;
            uVar8 = ptVar14->chr;
            uVar9 = ptVar14->attr;
            ptVar2 = &ldata->chars[uVar3].truecolour;
            uVar10 = *(unsigned_long *)(ptVar2 + 1);
            *(truecolour *)(puVar27 + 2) = *ptVar2;
            puVar27[3] = uVar10;
            *puVar27 = uVar8;
            puVar27[1] = uVar9;
            ptVar14 = *pptVar21;
            iVar5 = *(int *)((long)&ptVar14->cc_next + lVar25);
            if (iVar5 != 0) {
              *(uint *)((long)&ptVar14->cc_next + lVar25) = iVar5 + (uint)uVar3 + iVar30;
            }
            uVar28 = 0xdfff;
            if ((uVar23 != 0) ||
               (uVar6 = term->wcTo[uVar32].wc, uVar28 = (ulong)uVar6,
               term->wcTo[uVar32].origwc != uVar6)) goto LAB_0010c087;
          }
          uVar23 = uVar23 + 1;
          pbVar13 = term->wcTo;
          lVar25 = lVar25 + 0x20;
          iVar30 = iVar30 + -1;
        } while (uVar23 < pbVar13[uVar32].nchars);
        wVar29 = -iVar30;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar34);
  }
  if (wVar29 != term->cols) {
    __assert_fail("opos == term->cols",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x16e9,"termchar *term_bidi_line(Terminal *, struct termline *, int)");
  }
  ptVar14 = ldata->chars;
  ptVar31 = term->ltemp;
  pbVar13 = term->wcTo;
  factor1 = (size_t)ldata->size;
  _Var11 = ldata->trusted;
  pbVar15 = term->pre_bidi_cache;
  uVar34 = term->bidi_cache_size;
  if (pbVar15 == (bidi_cache_entry *)0x0 || uVar34 <= oldlen) {
    pbVar15 = (bidi_cache_entry *)safegrowarray(pbVar15,&term->bidi_cache_size,0x20,oldlen,1,false);
    term->pre_bidi_cache = pbVar15;
    pbVar16 = (bidi_cache_entry *)saferealloc(term->post_bidi_cache,term->bidi_cache_size,0x20);
    term->post_bidi_cache = pbVar16;
    pbVar15 = term->pre_bidi_cache;
    lVar25 = term->bidi_cache_size - uVar34;
    if (uVar34 <= term->bidi_cache_size && lVar25 != 0) {
      lVar33 = uVar34 << 5;
      do {
        *(undefined8 *)((long)&pbVar16->chars + lVar33) = 0;
        *(undefined8 *)((long)&pbVar15->chars + lVar33) = 0;
        *(undefined4 *)((long)&pbVar16->width + lVar33) = 0xffffffff;
        *(undefined4 *)((long)&pbVar15->width + lVar33) = 0xffffffff;
        (&pbVar15->trusted)[lVar33] = false;
        (&pbVar16->trusted)[lVar33] = false;
        *(undefined8 *)((long)&pbVar16->forward + lVar33) = 0;
        *(undefined8 *)((long)&pbVar15->forward + lVar33) = 0;
        *(undefined8 *)((long)&pbVar16->backward + lVar33) = 0;
        *(undefined8 *)((long)&pbVar15->backward + lVar33) = 0;
        lVar33 = lVar33 + 0x20;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
  }
  safefree(pbVar15[oldlen].chars);
  safefree(term->post_bidi_cache[oldlen].chars);
  safefree(term->post_bidi_cache[oldlen].forward);
  safefree(term->post_bidi_cache[oldlen].backward);
  pbVar15 = term->pre_bidi_cache;
  pbVar15[oldlen].width = wVar29;
  pbVar15[oldlen].trusted = _Var11;
  ptVar17 = (termchar *)safemalloc(factor1,0x20,0);
  term->pre_bidi_cache[oldlen].chars = ptVar17;
  pbVar15 = term->post_bidi_cache;
  pbVar15[oldlen].width = wVar29;
  pbVar15[oldlen].trusted = _Var11;
  ptVar17 = (termchar *)safemalloc(factor1,0x20,0);
  term->post_bidi_cache[oldlen].chars = ptVar17;
  uVar34 = (ulong)wVar29;
  pwVar18 = (wchar_t *)safemalloc(uVar34,4,0);
  term->post_bidi_cache[oldlen].forward = pwVar18;
  pwVar18 = (wchar_t *)safemalloc(uVar34,4,0);
  term->post_bidi_cache[oldlen].backward = pwVar18;
  memcpy(term->pre_bidi_cache[oldlen].chars,ptVar14,factor1 << 5);
  memcpy(term->post_bidi_cache[oldlen].chars,ptVar31,factor1 << 5);
  memset(term->post_bidi_cache[oldlen].forward,0,uVar34 * 4);
  memset(term->post_bidi_cache[oldlen].backward,0,uVar34 * 4);
  if (wVar29 != L'\0') {
    lVar25 = 0;
    uVar32 = 0;
    do {
      uVar3 = pbVar13[lVar25].index;
      if (uVar3 == 0xffff) {
        uVar28 = (ulong)pbVar13[lVar25].nchars;
      }
      else {
        if (wVar29 <= (int)(uint)uVar3) {
          __assert_fail("0 <= p && p < width",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x1663,
                        "void term_bidi_cache_store(Terminal *, int, termchar *, termchar *, bidi_char *, int, int, _Bool)"
                       );
        }
        uVar28 = (ulong)pbVar13[lVar25].nchars;
        if (uVar28 == 0) {
          uVar28 = 0;
        }
        else {
          pwVar18 = term->post_bidi_cache[oldlen].backward;
          pwVar7 = term->post_bidi_cache[oldlen].forward;
          uVar26 = 0;
          do {
            pwVar18[uVar32 + uVar26] = (uint)uVar3 + (int)uVar26;
            pwVar7[uVar3 + uVar26] = (int)uVar32 + (int)uVar26;
            uVar26 = uVar26 + 1;
          } while (uVar28 != uVar26);
        }
      }
      uVar32 = uVar32 + uVar28;
      lVar25 = lVar25 + 1;
    } while (uVar32 < uVar34);
  }
LAB_0010c38a:
  return *pptVar21;
}

Assistant:

static termchar *term_bidi_line(Terminal *term, struct termline *ldata,
                                int scr_y)
{
    termchar *lchars;
    int it;

    /* Do Arabic shaping and bidi. */
    if (!term->no_bidi || !term->no_arabicshaping ||
        (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH)) {

        if (!term_bidi_cache_hit(term, scr_y, ldata->chars, term->cols,
                                 ldata->trusted)) {

            if (term->wcFromTo_size < term->cols) {
                term->wcFromTo_size = term->cols;
                term->wcFrom = sresize(term->wcFrom, term->wcFromTo_size,
                                       bidi_char);
                term->wcTo = sresize(term->wcTo, term->wcFromTo_size,
                                     bidi_char);
            }

            for(it=0; it<term->cols ; it++)
            {
                unsigned long uc = (ldata->chars[it].chr);

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                term->wcFrom[it].origwc = term->wcFrom[it].wc =
                    (unsigned int)uc;
                term->wcFrom[it].index = it;
                term->wcFrom[it].nchars = 1;
            }

            if (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH) {
                memmove(
                    term->wcFrom + TRUST_SIGIL_WIDTH, term->wcFrom,
                    (term->cols - TRUST_SIGIL_WIDTH) * sizeof(*term->wcFrom));
                for (it = 0; it < TRUST_SIGIL_WIDTH; it++) {
                    term->wcFrom[it].origwc = term->wcFrom[it].wc =
                        (it == 0 ? TRUST_SIGIL_CHAR :
                         it == 1 ? UCSWIDE : ' ');
                    term->wcFrom[it].index = BIDI_CHAR_INDEX_NONE;
                    term->wcFrom[it].nchars = 1;
                }
            }

            int nbc = 0;
            for (it = 0; it < term->cols; it++) {
                term->wcFrom[nbc] = term->wcFrom[it];
                if (it+1 < term->cols && term->wcFrom[it+1].wc == UCSWIDE) {
                    term->wcFrom[nbc].nchars++;
                    it++;
                }
                nbc++;
            }

            if(!term->no_bidi)
                do_bidi(term->bidi_ctx, term->wcFrom, nbc);

            if(!term->no_arabicshaping) {
                do_shape(term->wcFrom, term->wcTo, nbc);
            } else {
                /* If we're not calling do_shape, we must copy the
                 * data into wcTo anyway, unchanged */
                memcpy(term->wcTo, term->wcFrom, nbc * sizeof(*term->wcTo));
            }

            if (term->ltemp_size < ldata->size) {
                term->ltemp_size = ldata->size;
                term->ltemp = sresize(term->ltemp, term->ltemp_size,
                                      termchar);
            }

            memcpy(term->ltemp, ldata->chars, ldata->size * TSIZE);

            int opos = 0;
            for (it=0; it<nbc; it++) {
                int ipos = term->wcTo[it].index;
                for (int j = 0; j < term->wcTo[it].nchars; j++) {
                    if (ipos != BIDI_CHAR_INDEX_NONE) {
                        term->ltemp[opos] = ldata->chars[ipos];
                        if (term->ltemp[opos].cc_next)
                            term->ltemp[opos].cc_next -= opos - ipos;

                        if (j > 0)
                            term->ltemp[opos].chr = UCSWIDE;
                        else if (term->wcTo[it].origwc != term->wcTo[it].wc)
                            term->ltemp[opos].chr = term->wcTo[it].wc;
                    } else {
                        term->ltemp[opos] = term->basic_erase_char;
                        term->ltemp[opos].chr =
                            j > 0 ? UCSWIDE : term->wcTo[it].origwc;
                    }
                    opos++;
                }
            }
            assert(opos == term->cols);
            term_bidi_cache_store(term, scr_y, ldata->chars,
                                  term->ltemp, term->wcTo,
                                  term->cols, ldata->size, ldata->trusted);

            lchars = term->ltemp;
        } else {
            lchars = term->post_bidi_cache[scr_y].chars;
        }
    } else {
        lchars = NULL;
    }

    return lchars;
}